

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * replace(string *__return_storage_ptr__,string *s,string *from,string *to)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  for (uVar2 = std::__cxx11::string::find
                         ((char *)__return_storage_ptr__,(ulong)(from->_M_dataplus)._M_p,0);
      uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find
                        ((char *)__return_storage_ptr__,(ulong)(from->_M_dataplus)._M_p,
                         uVar2 + to->_M_string_length)) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar2,(char *)from->_M_string_length,
               (ulong)(to->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string replace(const std::string & s, const std::string & from, const std::string & to) {
    std::string result = s;
    size_t pos = 0;
    while ((pos = result.find(from, pos)) != std::string::npos) {
        result.replace(pos, from.length(), to);
        pos += to.length();
    }
    return result;
}